

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::move
          (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this,
          basic_memory_buffer<char,_250UL,_std::allocator<char>_> *other)

{
  char *pcVar1;
  size_t count;
  size_t buf_capacity;
  size_t capacity;
  size_t size;
  char *data;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *other_local;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_local;
  
  pcVar1 = detail::buffer<char>::data(&other->super_buffer<char>);
  count = detail::buffer<char>::size(&other->super_buffer<char>);
  buf_capacity = detail::buffer<char>::capacity(&other->super_buffer<char>);
  if (pcVar1 == other->store_) {
    detail::buffer<char>::set(&this->super_buffer<char>,this->store_,buf_capacity);
    pcVar1 = detail::make_checked<char>(this->store_,buf_capacity);
    std::uninitialized_copy<char*,char*>(other->store_,other->store_ + count,pcVar1);
  }
  else {
    detail::buffer<char>::set(&this->super_buffer<char>,pcVar1,buf_capacity);
    detail::buffer<char>::set(&other->super_buffer<char>,other->store_,0);
  }
  resize(this,count);
  return;
}

Assistant:

void move(basic_memory_buffer& other) {
    alloc_ = std::move(other.alloc_);
    T* data = other.data();
    size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      std::uninitialized_copy(other.store_, other.store_ + size,
                              detail::make_checked(store_, capacity));
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
    }
    this->resize(size);
  }